

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::setQuarters
          (DateFormatSymbols *this,UnicodeString *quartersArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  UnicodeString *pUVar3;
  DtWidthType width_local;
  DtContextType context_local;
  int32_t count_local;
  UnicodeString *quartersArray_local;
  DateFormatSymbols *this_local;
  
  if (context == FORMAT) {
    if (width == ABBREVIATED) {
      if ((this->fShortQuarters != (UnicodeString *)0x0) &&
         (pUVar2 = this->fShortQuarters, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = quartersArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fShortQuarters = pUVar2;
      uprv_arrayCopy(quartersArray,this->fShortQuarters,count);
      this->fShortQuartersCount = count;
    }
    else if (width == WIDE) {
      if ((this->fQuarters != (UnicodeString *)0x0) &&
         (pUVar2 = this->fQuarters, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = quartersArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fQuarters = pUVar2;
      uprv_arrayCopy(quartersArray,this->fQuarters,count);
      this->fQuartersCount = count;
    }
  }
  else if (context == STANDALONE) {
    if (width == ABBREVIATED) {
      if ((this->fStandaloneShortQuarters != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneShortQuarters, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = quartersArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneShortQuarters = pUVar2;
      uprv_arrayCopy(quartersArray,this->fStandaloneShortQuarters,count);
      this->fStandaloneShortQuartersCount = count;
    }
    else if (width == WIDE) {
      if ((this->fStandaloneQuarters != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneQuarters, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = quartersArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneQuarters = pUVar2;
      uprv_arrayCopy(quartersArray,this->fStandaloneQuarters,count);
      this->fStandaloneQuartersCount = count;
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::setQuarters(const UnicodeString* quartersArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fQuarters)
                delete[] fQuarters;
            fQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fQuarters,count);
            fQuartersCount = count;
            break;
        case ABBREVIATED :
            if (fShortQuarters)
                delete[] fShortQuarters;
            fShortQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fShortQuarters,count);
            fShortQuartersCount = count;
            break;
        case NARROW :
        /*
            if (fNarrowQuarters)
                delete[] fNarrowQuarters;
            fNarrowQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fNarrowQuarters,count);
            fNarrowQuartersCount = count;
        */
            break;
        default :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneQuarters)
                delete[] fStandaloneQuarters;
            fStandaloneQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneQuarters,count);
            fStandaloneQuartersCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortQuarters)
                delete[] fStandaloneShortQuarters;
            fStandaloneShortQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneShortQuarters,count);
            fStandaloneShortQuartersCount = count;
            break;
        case NARROW :
        /*
           if (fStandaloneNarrowQuarters)
                delete[] fStandaloneNarrowQuarters;
            fStandaloneNarrowQuarters = newUnicodeStringArray(count);
            uprv_arrayCopy( quartersArray,fStandaloneNarrowQuarters,count);
            fStandaloneNarrowQuartersCount = count;
        */
            break;
        default :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}